

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingParserTarget::PixelFilter
          (FormattingParserTarget *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  undefined1 uVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  ParameterDictionary *in_RDX;
  long in_RDI;
  vector<float,_std::allocator<float>_> alpha;
  vector<float,_std::allocator<float>_> yr;
  vector<float,_std::allocator<float>_> xr;
  string extra;
  ParameterDictionary dict;
  string *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  ParameterDictionary *in_stack_fffffffffffffc58;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffc60;
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  FormattingParserTarget *in_stack_fffffffffffffc78;
  RGBColorSpace *in_stack_fffffffffffffc80;
  ParsedParameterVector *in_stack_fffffffffffffc88;
  string local_358 [28];
  int in_stack_fffffffffffffcc4;
  ParameterDictionary *in_stack_fffffffffffffcc8;
  string local_310 [32];
  string local_2f0 [39];
  allocator<char> local_2c9;
  string local_2c8 [39];
  undefined1 local_2a1 [33];
  vector<float,_std::allocator<float>_> local_280;
  string local_268 [32];
  string local_248 [39];
  undefined1 local_221 [40];
  undefined1 local_1f9 [33];
  vector<float,_std::allocator<float>_> local_1d8;
  string local_1c0 [32];
  string local_1a0 [39];
  undefined1 local_179 [40];
  undefined1 local_151 [33];
  vector<float,_std::allocator<float>_> local_130;
  string local_118 [280];
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_stack_fffffffffffffc60,&in_stack_fffffffffffffc58->params);
  ParameterDictionary::ParameterDictionary
            (in_RDX,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  std::__cxx11::string::string(local_118);
  if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
    in_stack_fffffffffffffc88 = (ParsedParameterVector *)local_151;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX,
               (char *)in_stack_fffffffffffffc88,(allocator<char> *)in_stack_fffffffffffffc80);
    ParameterDictionary::GetFloatArray
              (in_stack_fffffffffffffc58,
               (string *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    std::__cxx11::string::~string((string *)(local_151 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_151);
    sVar2 = std::vector<float,_std::allocator<float>_>::size(&local_130);
    if (sVar2 == 1) {
      in_stack_fffffffffffffc80 = (RGBColorSpace *)local_179;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX,
                 (char *)in_stack_fffffffffffffc88,(allocator<char> *)in_stack_fffffffffffffc80);
      ParameterDictionary::RemoveFloat
                ((ParameterDictionary *)
                 CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 in_stack_fffffffffffffc48);
      std::__cxx11::string::~string((string *)(local_179 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_179);
      indent_abi_cxx11_(in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
      std::vector<float,_std::allocator<float>_>::operator[](&local_130,0);
      StringPrintf<std::__cxx11::string,float&>
                ((char *)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                 (float *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
      std::__cxx11::string::operator+=(local_118,local_1a0);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string(local_1c0);
    }
    in_stack_fffffffffffffc78 = (FormattingParserTarget *)local_1f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX,
               (char *)in_stack_fffffffffffffc88,(allocator<char> *)in_stack_fffffffffffffc80);
    ParameterDictionary::GetFloatArray
              (in_stack_fffffffffffffc58,
               (string *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    std::__cxx11::string::~string((string *)(local_1f9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1f9);
    sVar2 = std::vector<float,_std::allocator<float>_>::size(&local_1d8);
    if (sVar2 == 1) {
      in_stack_fffffffffffffc70 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_221;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX,
                 (char *)in_stack_fffffffffffffc88,(allocator<char> *)in_stack_fffffffffffffc80);
      ParameterDictionary::RemoveFloat
                ((ParameterDictionary *)
                 CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 in_stack_fffffffffffffc48);
      std::__cxx11::string::~string((string *)(local_221 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_221);
      indent_abi_cxx11_(in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
      std::vector<float,_std::allocator<float>_>::operator[](&local_1d8,0);
      StringPrintf<std::__cxx11::string,float&>
                ((char *)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                 (float *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
      std::__cxx11::string::operator+=(local_118,local_248);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_268);
    }
    uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                            (char *)in_stack_fffffffffffffc48);
    if ((bool)uVar1) {
      in_stack_fffffffffffffc60 =
           (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
            *)local_2a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX,
                 (char *)in_stack_fffffffffffffc88,(allocator<char> *)in_stack_fffffffffffffc80);
      ParameterDictionary::GetFloatArray
                (in_stack_fffffffffffffc58,
                 (string *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      std::__cxx11::string::~string((string *)(local_2a1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_2a1);
      sVar2 = std::vector<float,_std::allocator<float>_>::size(&local_280);
      if (sVar2 == 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX,
                   (char *)in_stack_fffffffffffffc88,(allocator<char> *)in_stack_fffffffffffffc80);
        ParameterDictionary::RemoveFloat
                  ((ParameterDictionary *)
                   CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   in_stack_fffffffffffffc48);
        std::__cxx11::string::~string(local_2c8);
        std::allocator<char>::~allocator(&local_2c9);
        indent_abi_cxx11_(in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20))
        ;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_280,0);
        std::sqrt((double)(ulong)(uint)(*pvVar3 + *pvVar3));
        StringPrintf<std::__cxx11::string,float>
                  ((char *)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                   (float *)CONCAT17(uVar1,in_stack_fffffffffffffc68));
        std::__cxx11::string::operator+=(local_118,local_2f0);
        std::__cxx11::string::~string(local_2f0);
        std::__cxx11::string::~string(local_310);
      }
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc60);
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc60);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc60);
  }
  indent_abi_cxx11_(in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
  Printf<std::__cxx11::string,std::__cxx11::string_const&>
            ((char *)in_RDX,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc80);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffcc8);
  poVar4 = std::operator<<((ostream *)&std::cout,local_118);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4);
  std::operator<<(poVar4,local_358);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string(local_118);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x75af8f);
  return;
}

Assistant:

void FormattingParserTarget::PixelFilter(const std::string &name,
                                         ParsedParameterVector params, FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    std::string extra;
    if (upgrade) {
        std::vector<Float> xr = dict.GetFloatArray("xwidth");
        if (xr.size() == 1) {
            dict.RemoveFloat("xwidth");
            extra += StringPrintf("%s\"float xradius\" [ %f ]\n", indent(1), xr[0]);
        }
        std::vector<Float> yr = dict.GetFloatArray("ywidth");
        if (yr.size() == 1) {
            dict.RemoveFloat("ywidth");
            extra += StringPrintf("%s\"float yradius\" [ %f ]\n", indent(1), yr[0]);
        }

        if (name == "gaussian") {
            std::vector<Float> alpha = dict.GetFloatArray("alpha");
            if (alpha.size() == 1) {
                dict.RemoveFloat("alpha");
                extra += StringPrintf("%s\"float sigma\" [ %f ]\n", indent(1),
                                      1 / std::sqrt(2 * alpha[0]));
            }
        }
    }

    Printf("%sPixelFilter \"%s\"\n", indent(), name);
    std::cout << extra << dict.ToParameterList(catIndentCount);
}